

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

bool __thiscall blc::network::Socket::readable(Socket *this)

{
  ssize_t sVar1;
  int iVar2;
  long *in_RDI;
  fd_set *__arr;
  uint __i;
  char tmp;
  timeval timeout;
  fd_set fds;
  uint local_a8;
  undefined1 local_a1;
  timeval local_a0;
  fd_set local_90;
  bool local_1;
  
  memset(&local_a0,0,0x10);
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    local_1 = false;
  }
  else {
    for (local_a8 = 0; local_a8 < 0x10; local_a8 = local_a8 + 1) {
      local_90.fds_bits[local_a8] = 0;
    }
    iVar2 = (int)in_RDI[1] / 0x40;
    local_90.fds_bits[iVar2] =
         1L << ((byte)((long)(int)in_RDI[1] % 0x40) & 0x3f) | local_90.fds_bits[iVar2];
    iVar2 = select((int)in_RDI[1] + 1,&local_90,(fd_set *)0x0,(fd_set *)0x0,&local_a0);
    if (iVar2 < 1) {
      local_1 = false;
    }
    else {
      sVar1 = recv((int)in_RDI[1],&local_a1,1,0x42);
      if (sVar1 == 0) {
        (**(code **)(*in_RDI + 0x18))();
        local_1 = false;
      }
      else {
        local_1 = true;
      }
    }
  }
  return local_1;
}

Assistant:

bool blc::network::Socket::readable() const {
	fd_set		fds;
	struct timeval	timeout = {0, 0};
	char		tmp;

	if (this->_opened == false)
		return (false);
	FD_ZERO(&fds);
	FD_SET(this->_socket, &fds);
	if (select(this->_socket + 1, &fds, 0, 0, &timeout) <= 0)
		return (false);
	if (::recv(this->_socket, &tmp, 1, MSG_PEEK | MSG_DONTWAIT) == 0) {
		const_cast<blc::network::Socket *>(this)->close();
		return (false);
	}
	return (true);
}